

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasm_cpp.h
# Opt level: O2

void __thiscall
moira::Moira::dasmBcc<(moira::Instr)24,(moira::Mode)12,(moira::Size)1>
          (Moira *this,StrWriter *str,u32 *addr,u16 op)

{
  u32 uVar1;
  StrWriter *this_00;
  
  uVar1 = *addr;
  this_00 = StrWriter::operator<<(str);
  StrWriter::operator<<(this_00,(Align)(this->tab).raw);
  StrWriter::operator<<(this_00,(UInt)((int)(char)op + uVar1 + 2));
  return;
}

Assistant:

void
Moira::dasmBcc(StrWriter &str, u32 &addr, u16 op)
{
    if (MIMIC_MUSASHI && S == Byte && (u8)op == 0xFF) {
        dasmIllegal(str, addr, op);
        return;
    }

    u32 dst = addr + 2;
    dst += (S == Byte) ? (i8)op : (i16)dasmRead<S>(addr);

    str << Ins<I>{} << tab << UInt(dst);
}